

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int clamp_and_check_mv(int_mv *out_mv,int_mv in_mv,AV1_COMMON *cm,MACROBLOCK *x)

{
  FULLPEL_MV mv;
  int iVar1;
  MV *in_RCX;
  MV in_ESI;
  MV *in_RDI;
  MACROBLOCKD *xd;
  undefined8 in_stack_ffffffffffffffc8;
  FullMvLimits *mv_limits;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  MACROBLOCKD *xd_00;
  
  xd_00 = (MACROBLOCKD *)(in_RCX + 0x68);
  *in_RDI = in_ESI;
  lower_mv_precision((MV *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8)
  ;
  clamp_mv2(in_RCX,xd_00);
  mv_limits = (FullMvLimits *)(in_RCX + 0x7db9);
  mv = get_fullmv_from_mv(in_RDI);
  iVar1 = av1_is_fullmv_in_range(mv_limits,mv);
  return iVar1;
}

Assistant:

static inline int clamp_and_check_mv(int_mv *out_mv, int_mv in_mv,
                                     const AV1_COMMON *cm,
                                     const MACROBLOCK *x) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  *out_mv = in_mv;
  lower_mv_precision(&out_mv->as_mv, cm->features.allow_high_precision_mv,
                     cm->features.cur_frame_force_integer_mv);
  clamp_mv2(&out_mv->as_mv, xd);
  return av1_is_fullmv_in_range(&x->mv_limits,
                                get_fullmv_from_mv(&out_mv->as_mv));
}